

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

lys_module *
moveto_resolve_model
          (char *mod_name_ns,uint16_t mod_nam_ns_len,ly_ctx *ctx,lys_node *cur_snode,int is_name)

{
  int iVar1;
  lys_module *plVar2;
  char *local_68;
  char *local_60;
  char *local_58;
  lys_module *mainmod;
  lys_module *mod;
  char *str;
  uint16_t i;
  int is_name_local;
  lys_node *cur_snode_local;
  ly_ctx *ctx_local;
  uint16_t mod_nam_ns_len_local;
  char *mod_name_ns_local;
  
  if (cur_snode != (lys_node *)0x0) {
    if (((ctx->models).parsing_sub_modules_count == '\0') ||
       (cur_snode->module ==
        (ctx->models).parsing_sub_modules[(int)((ctx->models).parsing_sub_modules_count - 1)])) {
      mainmod = cur_snode->module;
    }
    else {
      mainmod = (ctx->models).parsing_sub_modules
                [(int)((ctx->models).parsing_sub_modules_count - 1)];
    }
    plVar2 = lys_main_module(mainmod);
    if (is_name == 0) {
      local_58 = plVar2->ns;
    }
    else {
      local_58 = plVar2->name;
    }
    iVar1 = strncmp(local_58,mod_name_ns,(ulong)mod_nam_ns_len);
    if ((iVar1 == 0) && (local_58[mod_nam_ns_len] == '\0')) {
      return plVar2;
    }
    for (str._2_2_ = 0; str._2_2_ < mainmod->imp_size; str._2_2_ = str._2_2_ + 1) {
      if (is_name == 0) {
        local_60 = (mainmod->imp[str._2_2_].module)->ns;
      }
      else {
        local_60 = (mainmod->imp[str._2_2_].module)->name;
      }
      iVar1 = strncmp(local_60,mod_name_ns,(ulong)mod_nam_ns_len);
      if ((iVar1 == 0) && (local_60[mod_nam_ns_len] == '\0')) {
        return mainmod->imp[str._2_2_].module;
      }
    }
  }
  str._2_2_ = 0;
  do {
    if ((ctx->models).used <= (int)(uint)str._2_2_) {
      return (lys_module *)0x0;
    }
    if (((char)(ctx->models).list[str._2_2_]->field_0x40 < '\0') &&
       (((byte)(ctx->models).list[str._2_2_]->field_0x40 >> 6 & 1) == 0)) {
      if (is_name == 0) {
        local_68 = (ctx->models).list[str._2_2_]->ns;
      }
      else {
        local_68 = (ctx->models).list[str._2_2_]->name;
      }
      iVar1 = strncmp(local_68,mod_name_ns,(ulong)mod_nam_ns_len);
      if ((iVar1 == 0) && (local_68[mod_nam_ns_len] == '\0')) {
        return (ctx->models).list[str._2_2_];
      }
    }
    str._2_2_ = str._2_2_ + 1;
  } while( true );
}

Assistant:

static struct lys_module *
moveto_resolve_model(const char *mod_name_ns, uint16_t mod_nam_ns_len, struct ly_ctx *ctx, struct lys_node *cur_snode,
                     int is_name)
{
    uint16_t i;
    const char *str;
    struct lys_module *mod, *mainmod;

    if (cur_snode) {
        /* detect if the XPath is used in augment - in such a case the module of the context node (cur_snode)
         * differs from the currently processed module. Then, we have to use the currently processed module
         * for searching for the module/namespace instead of the module of the context node */
        if (ctx->models.parsing_sub_modules_count &&
                cur_snode->module != ctx->models.parsing_sub_modules[ctx->models.parsing_sub_modules_count - 1]) {
            mod = ctx->models.parsing_sub_modules[ctx->models.parsing_sub_modules_count - 1];
        } else {
            mod = cur_snode->module;
        }
        mainmod = lys_main_module(mod);

        str = (is_name ? mainmod->name : mainmod->ns);
        if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
            return mainmod;
        }

        for (i = 0; i < mod->imp_size; ++i) {
            str = (is_name ? mod->imp[i].module->name : mod->imp[i].module->ns);
            if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
                return mod->imp[i].module;
            }
        }
    }

    for (i = 0; i < ctx->models.used; ++i) {
        if (!ctx->models.list[i]->implemented || ctx->models.list[i]->disabled) {
            /* skip not implemented or disabled modules */
            continue;
        }
        str = (is_name ? ctx->models.list[i]->name : ctx->models.list[i]->ns);
        if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
            return ctx->models.list[i];
        }
    }

    return NULL;
}